

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

void tcptran_ep_close(void *arg)

{
  void *pvVar1;
  
  nni_aio_close((nni_aio *)((long)arg + 0x218));
  nni_aio_close((nni_aio *)((long)arg + 0x50));
  nni_mtx_lock((nni_mtx *)arg);
  *(undefined1 *)((long)arg + 0x3a) = 1;
  if (*(nng_stream_dialer **)((long)arg + 0x410) != (nng_stream_dialer *)0x0) {
    nng_stream_dialer_close(*(nng_stream_dialer **)((long)arg + 0x410));
  }
  if (*(nng_stream_listener **)((long)arg + 0x418) != (nng_stream_listener *)0x0) {
    nng_stream_listener_close(*(nng_stream_listener **)((long)arg + 0x418));
  }
  if (*(nni_aio **)((long)arg + 0x48) != (nni_aio *)0x0) {
    nni_aio_finish_error(*(nni_aio **)((long)arg + 0x48),NNG_ECLOSED);
    *(undefined8 *)((long)arg + 0x48) = 0;
  }
  for (pvVar1 = nni_list_first((nni_list *)((long)arg + 0x3f8)); pvVar1 != (void *)0x0;
      pvVar1 = nni_list_next((nni_list *)((long)arg + 0x3f8),pvVar1)) {
    nni_pipe_close(*(nni_pipe **)((long)pvVar1 + 8));
  }
  for (pvVar1 = nni_list_first((nni_list *)((long)arg + 0x3e0)); pvVar1 != (void *)0x0;
      pvVar1 = nni_list_next((nni_list *)((long)arg + 0x3e0),pvVar1)) {
    nni_pipe_close(*(nni_pipe **)((long)pvVar1 + 8));
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
tcptran_ep_close(void *arg)
{
	tcptran_ep   *ep = arg;
	tcptran_pipe *p;

	nni_aio_close(&ep->timeaio);
	nni_aio_close(&ep->connaio);

	nni_mtx_lock(&ep->mtx);
	ep->closed = true;
	if (ep->dialer != NULL) {
		nng_stream_dialer_close(ep->dialer);
	}
	if (ep->listener != NULL) {
		nng_stream_listener_close(ep->listener);
	}
	if (ep->useraio != NULL) {
		nni_aio_finish_error(ep->useraio, NNG_ECLOSED);
		ep->useraio = NULL;
	}
	NNI_LIST_FOREACH (&ep->negopipes, p) {
		nni_pipe_close(p->npipe);
	}
	NNI_LIST_FOREACH (&ep->waitpipes, p) {
		nni_pipe_close(p->npipe);
	}
	nni_mtx_unlock(&ep->mtx);
}